

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int strcat_s(char *dst,size_t dstSizeInBytes,char *src)

{
  size_t sVar1;
  bool bVar2;
  size_t local_48;
  size_t bytes_to_cpy;
  size_t i;
  size_t src_len;
  size_t dstStrLen;
  int result;
  char *src_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  
  if (dst == (char *)0x0) {
    dstStrLen._4_4_ = 0x16;
  }
  else if (src == (char *)0x0) {
    *dst = '\0';
    dstStrLen._4_4_ = 0x16;
  }
  else if (dstSizeInBytes == 0) {
    dstStrLen._4_4_ = 0x22;
    *dst = '\0';
  }
  else {
    sVar1 = strlen(src);
    bytes_to_cpy = 0;
    while( true ) {
      bVar2 = false;
      if (bytes_to_cpy < dstSizeInBytes) {
        bVar2 = dst[bytes_to_cpy] != '\0';
      }
      if (!bVar2) break;
      bytes_to_cpy = bytes_to_cpy + 1;
    }
    if (dstSizeInBytes == bytes_to_cpy) {
      dstStrLen._4_4_ = 0x16;
    }
    else if (sVar1 + bytes_to_cpy < dstSizeInBytes) {
      local_48 = dstSizeInBytes - bytes_to_cpy;
      if (sVar1 < dstSizeInBytes - bytes_to_cpy) {
        local_48 = sVar1;
      }
      memcpy(dst + bytes_to_cpy,src,local_48);
      if (dst + bytes_to_cpy == (char *)0x0) {
        *dst = '\0';
        dstStrLen._4_4_ = 0x22;
      }
      else {
        dst[bytes_to_cpy + local_48] = '\0';
        dstStrLen._4_4_ = 0;
      }
    }
    else {
      *dst = '\0';
      dstStrLen._4_4_ = 0x22;
    }
  }
  return dstStrLen._4_4_;
}

Assistant:

int strcat_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    int result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_004: [If dst is NULL or unterminated, the error code returned shall be EINVAL & dst shall not be modified.]*/
    if (dst == NULL)
    {
        result = EINVAL;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_99_005: [If src is NULL, the error code returned shall be EINVAL and dst[0] shall be set to 0.]*/
    else if (src == NULL)
    {
        dst[0] = '\0';
        result = EINVAL;
    }
    else
    {
        /*Codes_SRS_CRT_ABSTRACTIONS_99_006: [If the dstSizeInBytes is 0 or smaller than the required size for dst & src, the error code returned shall be ERANGE & dst[0] set to 0.]*/
        if (dstSizeInBytes == 0)
        {
            result = ERANGE;
            dst[0] = '\0';
        }
        else
        {
            size_t dstStrLen = 0;
            size_t src_len = strlen(src);
#ifdef __STDC_LIB_EXT1__
            dstStrLen = strnlen_s(dst, dstSizeInBytes);
#else
            size_t i;
            for(i=0; (i < dstSizeInBytes) && (dst[i]!= '\0'); i++)
            {
            }
            dstStrLen = i;
#endif
            /*Codes_SRS_CRT_ABSTRACTIONS_99_004: [If dst is NULL or unterminated, the error code returned shall be EINVAL & dst shall not be modified.]*/
            if (dstSizeInBytes == dstStrLen) /* this means the dst string is not terminated*/
            {
                result = EINVAL;
            }
            // If we are instructed to write too much data to the buffer
            // return ERANGE
            else if ((src_len + dstStrLen) >= dstSizeInBytes)
            {
                dst[0] = '\0';
                result = ERANGE;
            }
            else
            {
                // memcpy should at most copy the result of strlen(src) or there may be
                // some issues with copying unwanted memory
                size_t bytes_to_cpy = dstSizeInBytes - dstStrLen;
                if (bytes_to_cpy > src_len)
                {
                    bytes_to_cpy = src_len;
                }

                /*Codes_SRS_CRT_ABSTRACTIONS_99_009: [The initial character of src shall overwrite the terminating null character of dst.]*/
                if (memcpy(&dst[dstStrLen], src, bytes_to_cpy) == NULL)
                /*Codes_SRS_CRT_ABSTRACTIONS_99_006: [If the dstSizeInBytes is 0 or smaller than the required size for dst & src, the error code returned shall be ERANGE & dst[0] set to 0.]*/
                {
                    dst[0] = '\0';
                    result = ERANGE;
                }
                else
                {
                    /*Codes_SRS_CRT_ABSTRACTIONS_99_003: [strcat_s shall return Zero upon success.]*/
                    dst[dstStrLen+bytes_to_cpy] = '\0';
                    result = 0;
                }
            }
        }
    }
    return result;
}